

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

Offset<const_MyGame::Example::Vec3_*> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<MyGame::Example::Vec3>
          (FlatBufferBuilderImpl<false> *this,Vec3 *structobj)

{
  uint *puVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  NotNested(this);
  if (this->minalign_ < 8) {
    this->minalign_ = 8;
  }
  vector_downward<unsigned_int>::fill(&this->buf_,(ulong)(-(this->buf_).size_ & 7));
  vector_downward<unsigned_int>::ensure_space(&this->buf_,0x20);
  puVar2 = (this->buf_).cur_;
  (this->buf_).cur_ = puVar2 + -0x20;
  puVar1 = &(this->buf_).size_;
  *puVar1 = *puVar1 + 0x20;
  uVar3 = *(undefined8 *)structobj;
  uVar4 = *(undefined8 *)&structobj->z_;
  uVar5 = *(undefined8 *)&structobj->test2_;
  *(double *)(puVar2 + -0x10) = structobj->test1_;
  *(undefined8 *)(puVar2 + -8) = uVar5;
  *(undefined8 *)(puVar2 + -0x20) = uVar3;
  *(undefined8 *)(puVar2 + -0x18) = uVar4;
  return (Offset<const_MyGame::Example::Vec3_*>)(this->buf_).size_;
}

Assistant:

Offset<const T *> CreateStruct(const T &structobj) {
    NotNested();
    Align(AlignOf<T>());
    buf_.push_small(structobj);
    return Offset<const T *>(
        CalculateOffset<typename Offset<const T *>::offset_type>());
  }